

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  short sVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  int iVar4;
  DOMDocument *pDVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  wchar16 *pwVar9;
  long lVar10;
  XMLCh *pXVar11;
  XMLSize_t XVar12;
  XMLCh toAppend;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  XMLCh XVar16;
  char *pcVar17;
  XMLBuffer elData;
  XMLBuffer rawUData;
  XMLBuffer local_4e90;
  char cFileName [4000];
  XMLCh tempStr_1 [4000];
  XMLCh tempStr [4000];
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (argc == 2) {
    pDVar5 = parseFile(argv[1]);
    if (pDVar5 != (DOMDocument *)0x0) {
      xercesc_4_0::XMLString::transcode
                ("testFile",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x70))(pDVar5,tempStr);
      lVar7 = (**(code **)(*plVar6 + 0x18))();
      lVar15 = 0;
LAB_00102670:
      if (lVar15 == lVar7) {
        printf("Encoding Tests Results Summary: \n   %d encoding tests run.\n   %d tests passed,\n   %d tests failed\n"
               ,(ulong)(uint)gTestsRun,(ulong)(uint)(gTestsRun - gTestsFailed));
        if (parser != (XercesDOMParser *)0x0) {
          (**(code **)(*(long *)parser + 8))();
        }
        parser = (XercesDOMParser *)0x0;
        return 0;
      }
      gTestsRun = gTestsRun + 1;
      plVar8 = (long *)(**(code **)(*plVar6 + 0x10))(plVar6,lVar15);
      xercesc_4_0::XMLString::transcode
                ("name",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pwVar9 = (wchar16 *)(**(code **)(*plVar8 + 0x148))(plVar8,tempStr);
      xercesc_4_0::XMLString::transcode
                (pwVar9,cFileName,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pDVar5 = parseFile(cFileName);
      if (pDVar5 != (DOMDocument *)0x0) {
        xercesc_4_0::XMLString::transcode
                  ("data",tempStr_1,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        plVar8 = (long *)(**(code **)(*(long *)pDVar5 + 0x70))(pDVar5,tempStr_1);
        lVar10 = (**(code **)(*plVar8 + 0x18))(plVar8);
        if (lVar10 != 1) {
          fprintf(_stderr,"Test file \"%s\" must have exactly one \"data\" element.\n",cFileName);
          goto LAB_00102bb5;
        }
        plVar8 = (long *)(**(code **)(*plVar8 + 0x10))(plVar8,0);
        elData.fIndex = 0;
        elData.fCapacity = 0x3ff;
        elData.fFullSize = 0;
        elData.fUsed = false;
        elData.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
        elData.fFullHandler = (XMLBufferFullHandler *)0x0;
        elData.fBuffer = (XMLCh *)0x0;
        elData.fBuffer =
             (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18))
                                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800);
        *elData.fBuffer = L'\0';
        plVar8 = (long *)(**(code **)(*plVar8 + 0x38))(plVar8);
        for (; plVar8 != (long *)0x0; plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8)) {
          iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
          if (iVar4 != 8) {
            iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
            if (((iVar4 != 3) && (iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8), iVar4 != 4)) &&
               (iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8), iVar4 != 5)) {
              pcVar17 = "Test file \"%s\": data element contains unexpected children.";
              goto LAB_00102b8d;
            }
            pXVar11 = (XMLCh *)(**(code **)(*plVar8 + 0x140))(plVar8);
            xercesc_4_0::XMLBuffer::append(&elData,pXVar11);
          }
        }
        xercesc_4_0::XMLString::transcode
                  ("udata",tempStr_1,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        plVar8 = (long *)(**(code **)(*(long *)pDVar5 + 0x70))(pDVar5,tempStr_1);
        lVar10 = (**(code **)(*plVar8 + 0x18))(plVar8);
        pcVar17 = "Test file \"%s\" must have exactly one \"udata\" element.\n";
        if (lVar10 != 1) {
LAB_00102b8d:
          fprintf(_stderr,pcVar17,cFileName);
LAB_00102ba9:
          xercesc_4_0::XMLBuffer::~XMLBuffer(&elData);
          goto LAB_00102bb5;
        }
        plVar8 = (long *)(**(code **)(*plVar8 + 0x10))(plVar8,0);
        rawUData.fIndex = 0;
        rawUData.fCapacity = 0x3ff;
        rawUData.fFullSize = 0;
        rawUData.fUsed = false;
        rawUData.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
        rawUData.fFullHandler = (XMLBufferFullHandler *)0x0;
        rawUData.fBuffer =
             (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18))
                                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800);
        *rawUData.fBuffer = L'\0';
        for (plVar8 = (long *)(**(code **)(*plVar8 + 0x38))(plVar8); plVar8 != (long *)0x0;
            plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8)) {
          iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
          if (iVar4 != 8) {
            iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
            if (((iVar4 != 3) && (iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8), iVar4 != 4)) &&
               (iVar4 = (**(code **)(*plVar8 + 0x20))(plVar8), iVar4 != 5)) {
              fprintf(_stderr,"Test file \"%s\": udata element contains unexpected children.",
                      cFileName);
              xercesc_4_0::XMLBuffer::~XMLBuffer(&rawUData);
              goto LAB_00102ba9;
            }
            pXVar11 = (XMLCh *)(**(code **)(*plVar8 + 0x140))(plVar8);
            xercesc_4_0::XMLBuffer::append(&rawUData,pXVar11);
          }
        }
        local_4e90.fIndex = 0;
        local_4e90.fCapacity = 0x3ff;
        local_4e90.fFullSize = 0;
        local_4e90.fUsed = false;
        local_4e90.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
        local_4e90.fFullHandler = (XMLBufferFullHandler *)0x0;
        local_4e90.fBuffer =
             (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18))
                                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800);
        *local_4e90.fBuffer = L'\0';
        uVar14 = 0;
LAB_00102973:
        do {
          pXVar3 = rawUData.fBuffer;
          pXVar11 = elData.fBuffer;
          if (rawUData.fIndex <= uVar14) {
            uVar13 = 0;
            goto LAB_00102a8f;
          }
          rawUData.fBuffer[rawUData.fIndex] = L'\0';
          XVar12 = xercesc_4_0::XMLString::stringLen(rawUData.fBuffer);
          pXVar11 = rawUData.fBuffer;
          while (((uVar14 < XVar12 && ((ulong)(ushort)pXVar3[uVar14] < 0x21)) &&
                 ((0x100000600U >> ((ulong)(ushort)pXVar3[uVar14] & 0x3f) & 1) != 0))) {
            uVar14 = (ulong)((int)uVar14 + 1);
          }
          rawUData.fBuffer[rawUData.fIndex] = L'\0';
          XVar12 = xercesc_4_0::XMLString::stringLen(rawUData.fBuffer);
          toAppend = L'\0';
          for (; uVar14 < XVar12; uVar14 = (ulong)((int)uVar14 + 1)) {
            XVar2 = pXVar11[uVar14];
            XVar16 = XVar2 + L'￠';
            if (5 < (ushort)(XVar2 + L'ﾟ')) {
              XVar16 = XVar2;
            }
            if (((ushort)(XVar16 + L'ﾹ') < 0xffe9) || ((ushort)(XVar16 + L'ￆ') < 7)) break;
            sVar1 = toAppend * 0x10 + -0x37;
            if ((ushort)XVar16 < 0x3a) {
              sVar1 = toAppend * 0x10 + -0x30;
            }
            toAppend = sVar1 + XVar16;
          }
          if (toAppend != L'\0') {
            xercesc_4_0::XMLBuffer::append(&local_4e90,toAppend);
            goto LAB_00102973;
          }
        } while (rawUData.fIndex <= uVar14);
        fprintf(_stderr,
                "Test file \"%s\": Bad hex number in udata element.  Data character number %llu\n",
                cFileName,local_4e90.fIndex);
        goto LAB_00102b6a;
      }
      goto LAB_00102bb5;
    }
  }
  else {
    printf("usage: %s file_name \n   where file name is the xml file specifying the list of test files."
           ,*argv);
  }
  return 1;
LAB_00102a8f:
  uVar14 = (ulong)uVar13;
  if (elData.fIndex <= uVar14) goto LAB_00102ab5;
  elData.fBuffer[elData.fIndex] = L'\0';
  local_4e90.fBuffer[local_4e90.fIndex] = L'\0';
  if (local_4e90.fIndex <= uVar14) {
    pcVar17 = "Test file \"%s\": udata element shorter than data at char number %d\n";
LAB_00102b22:
    fprintf(_stderr,pcVar17,cFileName);
    goto LAB_00102b65;
  }
  if (local_4e90.fBuffer[uVar14] != elData.fBuffer[uVar14]) {
    pcVar17 = "Test file \"%s\": comparison failure at character number %d\n";
    goto LAB_00102b22;
  }
  uVar13 = uVar13 + 1;
  goto LAB_00102a8f;
LAB_00102ab5:
  if (elData.fIndex == local_4e90.fIndex) {
    xercesc_4_0::XMLBuffer::~XMLBuffer(&local_4e90);
    xercesc_4_0::XMLBuffer::~XMLBuffer(&rawUData);
    xercesc_4_0::XMLBuffer::~XMLBuffer(&elData);
  }
  else {
    fprintf(_stderr,"Test file \"%s\": udata element longer than data at char number %d\n",cFileName
           );
    elData.fBuffer[elData.fIndex] = L'\0';
    pXVar11 = elData.fBuffer;
LAB_00102b65:
    writeUData(pXVar11);
LAB_00102b6a:
    xercesc_4_0::XMLBuffer::~XMLBuffer(&local_4e90);
    xercesc_4_0::XMLBuffer::~XMLBuffer(&rawUData);
    xercesc_4_0::XMLBuffer::~XMLBuffer(&elData);
LAB_00102bb5:
    gTestsFailed = gTestsFailed + 1;
  }
  lVar15 = lVar15 + 1;
  goto LAB_00102670;
}

Assistant:

int main(int argc, char ** argv) {

   //
    // Initialize the Xerces-c environment
    //
	try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        fprintf(stderr, "Error during initialization of xerces-c: %s\n",
            XMLString::transcode(toCatch.getMessage()));
         return 1;
    }

    //
    // Parse the command line, which should specify exactly one file, which is an
    //   xml file containing the list of test files to be processed.
    //
    if (argc != 2) {
        printf("usage: %s file_name \n"
               "   where file name is the xml file specifying the list of test files.", argv[0]);
        return 1;
    }
    DOMDocument* fileListDoc = parseFile(argv[1]);
    if (fileListDoc == 0) return 1;


    //
    // Iterate over the list of files, running each as a test.
    //
    XMLCh tempStr[4000];
    XMLString::transcode("testFile", tempStr, 3999);
    DOMNodeList* list = fileListDoc->getElementsByTagName(tempStr);
    XMLSize_t i;
    XMLSize_t numFiles = list->getLength();
    for (i=0; i<numFiles; i++)
    {
        ++gTestsRun;
        DOMNode* tmpNode3 = list->item(i);
        XMLString::transcode("name", tempStr, 3999);
        const XMLCh* fileName = ((DOMElement*) tmpNode3)->getAttribute(tempStr);
        if (processTestFile(fileName) == false)
            ++gTestsFailed;
    };



    //
    // We are done.  Print out a summary of the results
    //
    printf("Encoding Tests Results Summary: \n"
           "   %d encoding tests run.\n"
           "   %d tests passed,\n"
           "   %d tests failed\n", gTestsRun, gTestsRun-gTestsFailed, gTestsFailed);

    delete parser;
    parser = 0;
   return 0;
}